

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_load(parser *p)

{
  byte *pbVar1;
  char *name;
  char *file;
  prefs_data *d;
  parser *p_local;
  
  pbVar1 = (byte *)parser_priv(p);
  if (pbVar1 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x1b2,"enum parser_error parse_prefs_load(struct parser *)");
  }
  if ((*pbVar1 & 1) == 0) {
    name = parser_getstr(p,"file");
    process_pref_file(name,true,(_Bool)(pbVar1[0xf4] & 1));
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_load(struct parser *p)
{
	struct prefs_data *d = parser_priv(p);
	const char *file;

	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	file = parser_getstr(p, "file");
	(void)process_pref_file(file, true, d->user);

	return PARSE_ERROR_NONE;
}